

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Expression * __thiscall wasm::Builder::dropIfConcretelyTyped(Builder *this,Expression *curr)

{
  Drop *pDVar1;
  
  if (1 < (curr->type).id) {
    pDVar1 = makeDrop(this,curr);
    return (Expression *)pDVar1;
  }
  return curr;
}

Assistant:

Expression* dropIfConcretelyTyped(Expression* curr) {
    if (!curr->type.isConcrete()) {
      return curr;
    }
    return makeDrop(curr);
  }